

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

void ngx_rbtree_right_rotate
               (ngx_rbtree_node_t **root,ngx_rbtree_node_t *sentinel,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *temp;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_node_t *sentinel_local;
  ngx_rbtree_node_t **root_local;
  
  pnVar1 = node->left;
  node->left = pnVar1->right;
  if (pnVar1->right != sentinel) {
    pnVar1->right->parent = node;
  }
  pnVar1->parent = node->parent;
  if (node == *root) {
    *root = pnVar1;
  }
  else if (node == node->parent->right) {
    node->parent->right = pnVar1;
  }
  else {
    node->parent->left = pnVar1;
  }
  pnVar1->right = node;
  node->parent = pnVar1;
  return;
}

Assistant:

static ngx_inline void
ngx_rbtree_right_rotate(ngx_rbtree_node_t **root, ngx_rbtree_node_t *sentinel,
    ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *temp;

    temp = node->left;
    node->left = temp->right;

    if (temp->right != sentinel) {
        temp->right->parent = node;
    }

    temp->parent = node->parent;

    if (node == *root) {
        *root = temp;

    } else if (node == node->parent->right) {
        node->parent->right = temp;

    } else {
        node->parent->left = temp;
    }

    temp->right = node;
    node->parent = temp;
}